

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseImport(Parser *this,ImportRule *importRule)

{
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  char cVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Symbol *pSVar10;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->symbols).d.size;
  iVar8 = this->index;
  lVar9 = (long)iVar8;
  lVar7 = lVar1 - lVar9;
  if (lVar7 != 0 && lVar9 <= lVar1) {
    pSVar10 = (this->symbols).d.ptr + lVar9;
    do {
      iVar8 = iVar8 + 1;
      if (pSVar10->token != S) break;
      this->index = iVar8;
      pSVar10 = pSVar10 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  iVar8 = this->index;
  if ((iVar8 < lVar1) && ((this->symbols).d.ptr[iVar8].token == STRING)) {
    this->index = iVar8 + 1;
    Symbol::lexem(&local_38,(this->symbols).d.ptr + (long)(iVar8 + 1) + -1);
    pQVar2 = &((importRule->href).d.d)->super_QArrayData;
    pcVar3 = (importRule->href).d.ptr;
    (importRule->href).d.d = local_38.d.d;
    (importRule->href).d.ptr = local_38.d.ptr;
    qVar4 = (importRule->href).d.size;
    (importRule->href).d.size = local_38.d.size;
    local_38.d.d = (Data *)pQVar2;
    local_38.d.ptr = pcVar3;
    local_38.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
LAB_005ef157:
    cVar6 = QString::startsWith((QChar)(char16_t)importRule,0x27);
    if ((cVar6 != '\0') ||
       (cVar6 = QString::startsWith((QChar)(char16_t)importRule,0x22), cVar6 != '\0')) {
      QString::remove((longlong)importRule,0);
      QString::chop((longlong)importRule);
    }
    lVar1 = (this->symbols).d.size;
    iVar8 = this->index;
    lVar9 = (long)iVar8;
    lVar7 = lVar1 - lVar9;
    if (lVar7 != 0 && lVar9 <= lVar1) {
      pSVar10 = (this->symbols).d.ptr + lVar9;
      do {
        iVar8 = iVar8 + 1;
        if (pSVar10->token != S) break;
        this->index = iVar8;
        pSVar10 = pSVar10 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    iVar8 = this->index;
    if ((iVar8 < lVar1) && ((this->symbols).d.ptr[iVar8].token == IDENT)) {
      this->index = iVar8 + 1;
      while( true ) {
        parseMedium(this,&importRule->media);
        iVar8 = this->index;
        lVar1 = (this->symbols).d.size;
        if ((lVar1 <= iVar8) || ((this->symbols).d.ptr[iVar8].token != COMMA)) break;
        this->index = iVar8 + 1;
        lVar9 = (long)(iVar8 + 1);
        lVar7 = lVar1 - lVar9;
        if (lVar7 != 0 && lVar9 <= lVar1) {
          iVar8 = iVar8 + 2;
          pSVar10 = (this->symbols).d.ptr + lVar9;
          do {
            if (pSVar10->token != S) break;
            this->index = iVar8;
            iVar8 = iVar8 + 1;
            pSVar10 = pSVar10 + 1;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        iVar8 = this->index;
        if ((lVar1 <= iVar8) || ((this->symbols).d.ptr[iVar8].token != IDENT)) goto LAB_005ef2c7;
        this->index = iVar8 + 1;
      }
    }
    iVar8 = this->index;
    lVar1 = (this->symbols).d.size;
    if ((iVar8 < lVar1) &&
       (this->index = iVar8 + 1, (this->symbols).d.ptr[iVar8].token == SEMICOLON)) {
      iVar8 = this->index;
      lVar9 = (long)iVar8;
      bVar5 = true;
      lVar7 = lVar1 - lVar9;
      if (lVar7 != 0 && lVar9 <= lVar1) {
        pSVar10 = (this->symbols).d.ptr + lVar9;
        do {
          iVar8 = iVar8 + 1;
          if (pSVar10->token != S) break;
          this->index = iVar8;
          pSVar10 = pSVar10 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      goto LAB_005ef2cc;
    }
    iVar8 = this->index;
LAB_005ef2c7:
    this->errorIndex = iVar8;
  }
  else {
    bVar5 = testAndParseUri(this,&importRule->href);
    if (bVar5) goto LAB_005ef157;
  }
  bVar5 = false;
LAB_005ef2cc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool Parser::parseImport(ImportRule *importRule)
{
    skipSpace();

    if (test(STRING)) {
        importRule->href = lexem();
    } else {
        if (!testAndParseUri(&importRule->href)) return false;
    }
    removeOptionalQuotes(&importRule->href);

    skipSpace();

    if (testMedium()) {
        if (!parseMedium(&importRule->media)) return false;

        while (test(COMMA)) {
            skipSpace();
            if (!parseNextMedium(&importRule->media)) return false;
        }
    }

    if (!next(SEMICOLON)) return false;

    skipSpace();
    return true;
}